

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
woff2::anon_unknown_2::GlyfEncoder::WriteBbox(GlyfEncoder *this,int glyph_id,Glyph *glyph)

{
  byte *pbVar1;
  Glyph *glyph_local;
  int glyph_id_local;
  GlyfEncoder *this_local;
  
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->bbox_bitmap_,(long)(glyph_id >> 3));
  *pbVar1 = *pbVar1 | (byte)(0x80 >> ((byte)glyph_id & 7));
  WriteUShort(&this->bbox_stream_,(int)glyph->x_min);
  WriteUShort(&this->bbox_stream_,(int)glyph->y_min);
  WriteUShort(&this->bbox_stream_,(int)glyph->x_max);
  WriteUShort(&this->bbox_stream_,(int)glyph->y_max);
  return;
}

Assistant:

void WriteBbox(int glyph_id, const Glyph& glyph) {
    bbox_bitmap_[glyph_id >> 3] |= 0x80 >> (glyph_id & 7);
    WriteUShort(&bbox_stream_, glyph.x_min);
    WriteUShort(&bbox_stream_, glyph.y_min);
    WriteUShort(&bbox_stream_, glyph.x_max);
    WriteUShort(&bbox_stream_, glyph.y_max);
  }